

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void turn(int x,int y)

{
  char (*pacVar1) [15];
  int i;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  pacVar1 = board;
  board[x][y] = '\x02';
  uVar2 = 0;
  do {
    lVar3 = 0;
    uVar4 = uVar2;
    do {
      if ((*pacVar1)[lVar3] == '\0') goto LAB_001012c4;
      lVar3 = lVar3 + 1;
      uVar4 = uVar4 + 0x100000000;
    } while (lVar3 != 0xf);
    uVar2 = uVar2 + 1;
    pacVar1 = pacVar1 + 1;
  } while (uVar2 != 0xf);
  uVar4 = 0;
LAB_001012c4:
  board[(int)uVar4][(long)uVar4 >> 0x20] = '\x01';
  printf("%d %d\n",(long)(int)uVar4,uVar4 >> 0x20);
  fflush(_stdout);
  return;
}

Assistant:

void turn(int x, int y) {
    board[x][y] = OTHER;

    // AI
    struct Position pos = aiTurn((const char (*)[BOARD_SIZE]) board, ME, x, y);
    board[pos.x][pos.y] = ME;
    printf("%d %d\n", pos.x, pos.y);
    fflush(stdout);
}